

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSAttribute.cpp
# Opt level: O0

void __thiscall OSAttribute::OSAttribute(OSAttribute *this,OSAttribute *in)

{
  long in_RSI;
  undefined8 *in_RDI;
  ByteString *in_stack_ffffffffffffffb8;
  ByteString *this_00;
  
  *in_RDI = &PTR__OSAttribute_00220588;
  ByteString::ByteString((ByteString *)0x1daef0);
  this_00 = (ByteString *)(in_RDI + 8);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             0x1daf03);
  std::
  map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
  ::map((map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
         *)0x1daf16);
  *(undefined4 *)(in_RDI + 1) = *(undefined4 *)(in_RSI + 8);
  *(byte *)((long)in_RDI + 0xc) = *(byte *)(in_RSI + 0xc) & 1;
  in_RDI[2] = *(undefined8 *)(in_RSI + 0x10);
  ByteString::operator=(this_00,in_stack_ffffffffffffffb8);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::operator=
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)this_00
             ,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
              in_stack_ffffffffffffffb8);
  std::
  map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
  ::operator=((map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
               *)this_00,
              (map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
               *)in_stack_ffffffffffffffb8);
  return;
}

Assistant:

OSAttribute::OSAttribute(const OSAttribute& in)
{
	attributeType = in.attributeType;
	boolValue = in.boolValue;
	ulongValue = in.ulongValue;
	byteStrValue = in.byteStrValue;
	mechSetValue = in.mechSetValue;
	attrMapValue = in.attrMapValue;
}